

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O1

bool ASDCP::ATMOS::IsDolbyAtmos(string *filename)

{
  int iVar1;
  ulong __n;
  bool bVar2;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"atmos","");
  Kumu::PathGetExtension((string *)&local_40);
  __n = local_58;
  if (local_38 < local_58) {
    __n = local_38;
  }
  if (__n == 0) {
    bVar2 = true;
  }
  else {
    iVar1 = bcmp(local_60,local_40,__n);
    bVar2 = iVar1 == 0;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return (bool)(bVar2 & local_58 == local_38);
}

Assistant:

bool
ASDCP::ATMOS::IsDolbyAtmos(const std::string& filename)
{
    // TODO
    // For now use an atmos extension
    bool result = ( 0 == (std::string("atmos").compare(Kumu::PathGetExtension(filename))) );
    return result;
}